

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int ecp_double_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P)

{
  mbedtls_mpi *pmVar1;
  int iVar2;
  mbedtls_mpi *pmVar3;
  mbedtls_mpi S;
  mbedtls_mpi T;
  mbedtls_mpi U;
  mbedtls_mpi M;
  mbedtls_mpi local_a0;
  mbedtls_mpi *local_88;
  mbedtls_mpi local_80;
  mbedtls_mpi local_68;
  mbedtls_mpi *local_50;
  mbedtls_mpi local_48;
  
  dbl_count = dbl_count + 1;
  mbedtls_mpi_init(&local_48);
  mbedtls_mpi_init(&local_a0);
  mbedtls_mpi_init(&local_80);
  mbedtls_mpi_init(&local_68);
  if ((grp->A).p == (mbedtls_mpi_uint *)0x0) {
    iVar2 = mbedtls_mpi_mul_mpi(&local_a0,&P->Z,&P->Z);
    if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_a0,grp), iVar2 == 0)) {
      mul_count = mul_count + 1;
      iVar2 = mbedtls_mpi_add_mpi(&local_80,&P->X,&local_a0);
      if (iVar2 == 0) {
        pmVar3 = &grp->P;
        do {
          iVar2 = mbedtls_mpi_cmp_mpi(&local_80,pmVar3);
          if (iVar2 < 0) {
            iVar2 = mbedtls_mpi_sub_mpi(&local_68,&P->X,&local_a0);
            if (iVar2 == 0) {
              goto LAB_0016b626;
            }
            break;
          }
          iVar2 = mbedtls_mpi_sub_abs(&local_80,&local_80,pmVar3);
        } while (iVar2 == 0);
      }
    }
  }
  else {
    iVar2 = mbedtls_mpi_mul_mpi(&local_a0,&P->X,&P->X);
    if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_a0,grp), iVar2 == 0)) {
      mul_count = mul_count + 1;
      iVar2 = mbedtls_mpi_mul_int(&local_48,&local_a0,3);
      if (iVar2 == 0) {
        local_50 = &grp->A;
        pmVar3 = &grp->P;
        do {
          iVar2 = mbedtls_mpi_cmp_mpi(&local_48,pmVar3);
          pmVar1 = local_50;
          if (iVar2 < 0) {
            iVar2 = mbedtls_mpi_cmp_int(local_50,0);
            if (iVar2 == 0) goto LAB_0016b6d5;
            iVar2 = mbedtls_mpi_mul_mpi(&local_a0,&P->Z,&P->Z);
            if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_a0,grp), iVar2 == 0)) {
              mul_count = mul_count + 1;
              iVar2 = mbedtls_mpi_mul_mpi(&local_80,&local_a0,&local_a0);
              if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_80,grp), iVar2 == 0)) {
                mul_count = mul_count + 1;
                iVar2 = mbedtls_mpi_mul_mpi(&local_a0,&local_80,pmVar1);
                if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_a0,grp), iVar2 == 0)) {
                  mul_count = mul_count + 1;
                  iVar2 = mbedtls_mpi_add_mpi(&local_48,&local_48,&local_a0);
                  if (iVar2 == 0) {
                    goto LAB_0016b5db;
                  }
                }
              }
            }
            break;
          }
          iVar2 = mbedtls_mpi_sub_abs(&local_48,&local_48,pmVar3);
        } while (iVar2 == 0);
      }
    }
  }
  goto LAB_0016b499;
  while (iVar2 = mbedtls_mpi_add_mpi(&local_68,&local_68,pmVar3), iVar2 == 0) {
LAB_0016b626:
    if ((-1 < local_68.s) || (iVar2 = mbedtls_mpi_cmp_int(&local_68,0), iVar2 == 0)) {
      iVar2 = mbedtls_mpi_mul_mpi(&local_a0,&local_80,&local_68);
      if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_a0,grp), iVar2 == 0)) {
        mul_count = mul_count + 1;
        iVar2 = mbedtls_mpi_mul_int(&local_48,&local_a0,3);
        if (iVar2 == 0) {
          goto LAB_0016b6ad;
        }
      }
      break;
    }
  }
  goto LAB_0016b499;
  while (iVar2 = mbedtls_mpi_sub_abs(&local_48,&local_48,pmVar3), iVar2 == 0) {
LAB_0016b6ad:
    iVar2 = mbedtls_mpi_cmp_mpi(&local_48,pmVar3);
    if (iVar2 < 0) goto LAB_0016b6d5;
  }
  goto LAB_0016b499;
  while (iVar2 = mbedtls_mpi_sub_abs(&local_48,&local_48,pmVar3), iVar2 == 0) {
LAB_0016b5db:
    iVar2 = mbedtls_mpi_cmp_mpi(&local_48,pmVar3);
    if (iVar2 < 0) goto LAB_0016b6d5;
  }
  goto LAB_0016b499;
LAB_0016b6d5:
  pmVar3 = &P->Y;
  iVar2 = mbedtls_mpi_mul_mpi(&local_80,pmVar3,pmVar3);
  if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_80,grp), iVar2 == 0)) {
    mul_count = mul_count + 1;
    iVar2 = mbedtls_mpi_shift_l(&local_80,1);
    if (iVar2 == 0) {
      pmVar1 = &grp->P;
      local_50 = pmVar3;
      do {
        iVar2 = mbedtls_mpi_cmp_mpi(&local_80,pmVar1);
        if (iVar2 < 0) {
          local_88 = pmVar1;
          iVar2 = mbedtls_mpi_mul_mpi(&local_a0,&P->X,&local_80);
          if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_a0,grp), iVar2 == 0)) {
            mul_count = mul_count + 1;
            iVar2 = mbedtls_mpi_shift_l(&local_a0,1);
            pmVar3 = local_88;
            if (iVar2 == 0) {
              goto LAB_0016b7b6;
            }
          }
          break;
        }
        iVar2 = mbedtls_mpi_sub_abs(&local_80,&local_80,pmVar1);
      } while (iVar2 == 0);
    }
  }
  goto LAB_0016b499;
  while (iVar2 = mbedtls_mpi_sub_abs(&local_a0,&local_a0,pmVar3), iVar2 == 0) {
LAB_0016b7b6:
    iVar2 = mbedtls_mpi_cmp_mpi(&local_a0,pmVar3);
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_mul_mpi(&local_68,&local_80,&local_80);
      if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_68,grp), iVar2 == 0)) {
        mul_count = mul_count + 1;
        iVar2 = mbedtls_mpi_shift_l(&local_68,1);
        if (iVar2 == 0) {
          pmVar3 = local_88;
          goto LAB_0016b835;
        }
      }
      break;
    }
  }
  goto LAB_0016b499;
  while (iVar2 = mbedtls_mpi_sub_abs(&local_68,&local_68,local_88), iVar2 == 0) {
LAB_0016b835:
    iVar2 = mbedtls_mpi_cmp_mpi(&local_68,pmVar3);
    pmVar3 = local_88;
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_mul_mpi(&local_80,&local_48,&local_48);
      if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_80,grp), iVar2 == 0)) {
        mul_count = mul_count + 1;
        iVar2 = mbedtls_mpi_sub_mpi(&local_80,&local_80,&local_a0);
        if (iVar2 == 0) {
          goto LAB_0016b8b7;
        }
      }
      break;
    }
  }
  goto LAB_0016b499;
  while (iVar2 = mbedtls_mpi_add_mpi(&local_80,&local_80,local_88), iVar2 == 0) {
LAB_0016b8b7:
    if ((-1 < local_80.s) || (iVar2 = mbedtls_mpi_cmp_int(&local_80,0), iVar2 == 0)) {
      iVar2 = mbedtls_mpi_sub_mpi(&local_80,&local_80,&local_a0);
      if (iVar2 == 0) {
        goto LAB_0016b906;
      }
      break;
    }
  }
  goto LAB_0016b499;
  while (iVar2 = mbedtls_mpi_add_mpi(&local_80,&local_80,local_88), iVar2 == 0) {
LAB_0016b906:
    if ((-1 < local_80.s) || (iVar2 = mbedtls_mpi_cmp_int(&local_80,0), iVar2 == 0)) {
      iVar2 = mbedtls_mpi_sub_mpi(&local_a0,&local_a0,&local_80);
      if (iVar2 == 0) {
        goto LAB_0016b955;
      }
      break;
    }
  }
  goto LAB_0016b499;
  while (iVar2 = mbedtls_mpi_add_mpi(&local_a0,&local_a0,local_88), iVar2 == 0) {
LAB_0016b955:
    if ((-1 < local_a0.s) || (iVar2 = mbedtls_mpi_cmp_int(&local_a0,0), iVar2 == 0)) {
      iVar2 = mbedtls_mpi_mul_mpi(&local_a0,&local_a0,&local_48);
      if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_a0,grp), iVar2 == 0)) {
        mul_count = mul_count + 1;
        iVar2 = mbedtls_mpi_sub_mpi(&local_a0,&local_a0,&local_68);
        if (iVar2 == 0) {
          goto LAB_0016b9da;
        }
      }
      break;
    }
  }
  goto LAB_0016b499;
  while (iVar2 = mbedtls_mpi_add_mpi(&local_a0,&local_a0,local_88), iVar2 == 0) {
LAB_0016b9da:
    if ((-1 < local_a0.s) || (iVar2 = mbedtls_mpi_cmp_int(&local_a0,0), iVar2 == 0)) {
      iVar2 = mbedtls_mpi_mul_mpi(&local_68,local_50,&P->Z);
      if ((iVar2 == 0) && (iVar2 = ecp_modp(&local_68,grp), iVar2 == 0)) {
        mul_count = mul_count + 1;
        iVar2 = mbedtls_mpi_shift_l(&local_68,1);
        if (iVar2 == 0) {
          pmVar3 = local_88;
          goto LAB_0016ba65;
        }
      }
      break;
    }
  }
  goto LAB_0016b499;
  while (iVar2 = mbedtls_mpi_sub_abs(&local_68,&local_68,local_88), iVar2 == 0) {
LAB_0016ba65:
    iVar2 = mbedtls_mpi_cmp_mpi(&local_68,pmVar3);
    pmVar3 = local_88;
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_copy(&R->X,&local_80);
      if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_copy(&R->Y,&local_a0), iVar2 == 0)) {
        iVar2 = mbedtls_mpi_copy(&R->Z,&local_68);
      }
      break;
    }
  }
LAB_0016b499:
  mbedtls_mpi_free(&local_48);
  mbedtls_mpi_free(&local_a0);
  mbedtls_mpi_free(&local_80);
  mbedtls_mpi_free(&local_68);
  return iVar2;
}

Assistant:

static int ecp_double_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                           const mbedtls_ecp_point *P )
{
    int ret;
    mbedtls_mpi M, S, T, U;

#if defined(MBEDTLS_SELF_TEST)
    dbl_count++;
#endif

    mbedtls_mpi_init( &M ); mbedtls_mpi_init( &S ); mbedtls_mpi_init( &T ); mbedtls_mpi_init( &U );

    /* Special case for A = -3 */
    if( grp->A.p == NULL )
    {
        /* M = 3(X + Z^2)(X - Z^2) */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &P->Z,  &P->Z   ) ); MOD_MUL( S );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &T,  &P->X,  &S      ) ); MOD_ADD( T );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U,  &P->X,  &S      ) ); MOD_SUB( U );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &T,     &U      ) ); MOD_MUL( S );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M,  &S,     3       ) ); MOD_ADD( M );
    }
    else
    {
        /* M = 3.X^2 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &P->X,  &P->X   ) ); MOD_MUL( S );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M,  &S,     3       ) ); MOD_ADD( M );

        /* Optimize away for "koblitz" curves with A = 0 */
        if( mbedtls_mpi_cmp_int( &grp->A, 0 ) != 0 )
        {
            /* M += A.Z^4 */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &P->Z,  &P->Z   ) ); MOD_MUL( S );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T,  &S,     &S      ) ); MOD_MUL( T );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &T,     &grp->A ) ); MOD_MUL( S );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &M,  &M,     &S      ) ); MOD_ADD( M );
        }
    }

    /* S = 4.X.Y^2 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T,  &P->Y,  &P->Y   ) ); MOD_MUL( T );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T,  1               ) ); MOD_ADD( T );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &P->X,  &T      ) ); MOD_MUL( S );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &S,  1               ) ); MOD_ADD( S );

    /* U = 8.Y^4 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &U,  &T,     &T      ) ); MOD_MUL( U );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &U,  1               ) ); MOD_ADD( U );

    /* T = M^2 - 2.S */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T,  &M,     &M      ) ); MOD_MUL( T );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T,  &T,     &S      ) ); MOD_SUB( T );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T,  &T,     &S      ) ); MOD_SUB( T );

    /* S = M(S - T) - U */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &S,  &S,     &T      ) ); MOD_SUB( S );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &S,  &S,     &M      ) ); MOD_MUL( S );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &S,  &S,     &U      ) ); MOD_SUB( S );

    /* U = 2.Y.Z */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &U,  &P->Y,  &P->Z   ) ); MOD_MUL( U );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &U,  1               ) ); MOD_ADD( U );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->X, &T ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Y, &S ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Z, &U ) );

cleanup:
    mbedtls_mpi_free( &M ); mbedtls_mpi_free( &S ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &U );

    return( ret );
}